

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O3

bool __thiscall
OpenMD::ForceFieldOptions::setData(ForceFieldOptions *this,string *keyword,string *value)

{
  long *plVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  long *local_50 [2];
  long local_40 [2];
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    snprintf(painCave.errMsg,2000,"%s is an unrecognized keyword\n",(keyword->_M_dataplus)._M_p);
    painCave.isFatal = 0;
  }
  else {
    bVar3 = isInteger(value);
    if (bVar3) {
      iVar5 = lexi_cast<int>(value);
      cVar4 = (**(code **)(**(long **)(iVar6._M_node + 2) + 0x20))
                        (*(long **)(iVar6._M_node + 2),iVar5);
    }
    else {
      bVar3 = isType<double>(value);
      if (bVar3) {
        lexi_cast<double>(value);
        cVar4 = (**(code **)(**(long **)(iVar6._M_node + 2) + 0x30))();
      }
      else {
        plVar1 = *(long **)(iVar6._M_node + 2);
        pcVar2 = (value->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar2,pcVar2 + value->_M_string_length);
        cVar4 = (**(code **)(*plVar1 + 0x18))(plVar1,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
    }
    if (cVar4 != '\0') {
      return true;
    }
    snprintf(painCave.errMsg,2000,"Unrecognized data type for keyword: %s = %s\n",
             (keyword->_M_dataplus)._M_p,(value->_M_dataplus)._M_p);
    painCave.isFatal = 1;
  }
  simError();
  return false;
}

Assistant:

bool setData(const std::string& keyword, const std::string& value) {
      bool result(false);
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        if (isInteger(value)) {
          int ival = lexi_cast<int>(value);
          result   = i->second->setData(ival);
        } else if (isType<RealType>(value)) {
          RealType dval = lexi_cast<RealType>(value);
          result        = i->second->setData(dval);
        } else {
          result = i->second->setData(value);
        }

        if (!result) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Unrecognized data type for keyword: %s = %s\n",
                   keyword.c_str(), value.c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s is an unrecognized keyword\n", keyword.c_str());
        painCave.isFatal = 0;
        simError();
      }

      return result;
    }